

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>::format
          (source_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  char *buf_ptr;
  ptrdiff_t _Num;
  scoped_padder p;
  scoped_padder sStack_48;
  
  if ((msg->source).line != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar1 = strlen((msg->source).filename);
    }
    else {
      sVar1 = 0;
    }
    scoped_padder::scoped_padder(&sStack_48,sVar1,&(this->super_flag_formatter).padinfo_,dest);
    __s = (msg->source).filename;
    sVar1 = strlen(__s);
    if (__s != (char *)0x0) {
      uVar2 = (dest->super_buffer<char>).size_ + sVar1;
      if ((dest->super_buffer<char>).capacity_ < uVar2) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar2);
      }
      if (sVar1 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,sVar1);
      }
      (dest->super_buffer<char>).size_ = uVar2;
    }
    scoped_padder::~scoped_padder(&sStack_48);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}